

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O3

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CCompoundStm *stm)

{
  IStatement *pIVar1;
  
  pIVar1 = (stm->leftStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  if (pIVar1 != (IStatement *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  }
  pIVar1 = (stm->rightStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  if (pIVar1 != (IStatement *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    return;
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CCompoundStm &stm) {
	if (stm.leftStatement) {
		stm.leftStatement->Accept(*this);
	}
	if (stm.rightStatement) {
		stm.rightStatement->Accept(*this);
	}
}